

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void blend_color_generic_fp(int count,QT_FT_Span *spans,void *userData)

{
  BPP BVar1;
  bool bVar2;
  int iVar3;
  int priority;
  QThreadPool *pQVar4;
  ulong uVar5;
  QSpanData *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  byte bVar6;
  int cn;
  int i;
  int c;
  QThreadPool *threadPool;
  int segments;
  BPP bpp;
  bool solidFill;
  QSpanData *data;
  QSemaphore semaphore;
  anon_class_48_6_31ab0bab function;
  QRgbaFloat32 color;
  float a;
  float b;
  float g;
  float r;
  Operator op;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  int iVar7;
  undefined4 in_stack_fffffffffffffe6c;
  int iVar8;
  QMessageLogger *in_stack_fffffffffffffe70;
  QThreadPool *this;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe84;
  QSpanData *data_00;
  undefined1 *local_140;
  int *local_138 [2];
  byte local_128;
  BPP local_124;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 local_ec;
  char local_e8 [32];
  int local_c8 [22];
  long local_70;
  long local_58;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  data_00 = in_RDX;
  memcpy(local_c8,&DAT_00bfe388,0xb0);
  getOperator(data_00,(QT_FT_Span *)in_RDX,in_stack_fffffffffffffe84);
  if ((local_58 == 0) || (local_70 == 0)) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    lcQtGuiDrawHelper();
    anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    while( true ) {
      bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar2) break;
      anon_unknown.dwarf_1ff9083::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xb47712);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe70,
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 in_stack_fffffffffffffe64,(char *)in_stack_fffffffffffffe58,(char *)0xb4772b);
      QMessageLogger::debug
                (local_e8,
                 "blend_color_generic_fp: unsupported 4xF16 blend attempted, falling back to 32-bit"
                );
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    blend_color_generic((int)((ulong)in_RSI >> 0x20),(QT_FT_Span *)data_00,in_RDX);
  }
  else {
    local_ec = 0xffffffff;
    local_f0 = 0xffffffff;
    local_f4 = 0xffffffff;
    local_f8 = 0xffffffff;
    QColor::getRgbF((QColor *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                    (float *)in_stack_fffffffffffffe70,
                    (float *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                    (float *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                    (float *)in_stack_fffffffffffffe58);
    local_108 = CONCAT44(local_f0,local_ec);
    local_100 = CONCAT44(local_f8,local_f4);
    bVar6 = local_c8[0] == 3;
    BVar1 = qPixelLayouts[in_RDX->rasterBuffer->format].bpp;
    memcpy(local_138,&DAT_00bfe440,0x30);
    local_138[0] = local_c8;
    local_128 = bVar6 & 1;
    local_118 = local_108;
    local_110 = local_100;
    iVar3 = (in_EDI + 0x20) / 0x40;
    local_124 = BVar1;
    pQVar4 = QGuiApplicationPrivate::qtGuiThreadPool();
    this = pQVar4;
    if ((1 < iVar3) &&
       ((2 < (int)qPixelLayouts[in_RDX->rasterBuffer->format].bpp && (pQVar4 != (QThreadPool *)0x0))
       )) {
      QThread::currentThread();
      uVar5 = QThreadPool::contains((QThread *)pQVar4);
      if ((uVar5 & 1) == 0) {
        local_140 = &DAT_aaaaaaaaaaaaaaaa;
        QSemaphore::QSemaphore((QSemaphore *)&local_140,0);
        iVar8 = 0;
        for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
          priority = (in_EDI - iVar8) / (iVar3 - iVar7);
          QThreadPool::
          start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_gui_painting_qdrawhelper_cpp:4145:5),_true>
                    (this,(anon_class_24_4_b418dff8_for_o *)CONCAT44(iVar8,iVar7),priority);
          iVar8 = priority + iVar8;
        }
        QSemaphore::acquire((int)&local_140);
        QSemaphore::~QSemaphore((QSemaphore *)&local_140);
        goto LAB_00b47a22;
      }
    }
    blend_color_generic_fp::anon_class_48_6_31ab0bab::operator()
              ((anon_class_48_6_31ab0bab *)CONCAT44(iVar3,in_stack_fffffffffffffe78),
               (int)((ulong)this >> 0x20),(int)this);
  }
LAB_00b47a22:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void blend_color_generic_fp(int count, const QT_FT_Span *spans, void *userData)
{
#if QT_CONFIG(raster_fp)
    QSpanData *data = reinterpret_cast<QSpanData *>(userData);
    const Operator op = getOperator(data, nullptr, 0);
    if (!op.funcSolidFP || !op.destFetchFP) {
        qCDebug(lcQtGuiDrawHelper, "blend_color_generic_fp: unsupported 4xF16 blend attempted, falling back to 32-bit");
        return blend_color_generic(count, spans, userData);
    }

    float r, g, b, a;
    data->solidColor.getRgbF(&r, &g, &b, &a);
    const QRgbaFloat32 color{r, g, b, a};
    const bool solidFill = op.mode == QPainter::CompositionMode_Source;
    QPixelLayout::BPP bpp = qPixelLayouts[data->rasterBuffer->format].bpp;

    auto function = [=, &op] (int cStart, int cEnd)
    {
        alignas(16) Q_DECL_UNINITIALIZED QRgbaFloat32 buffer[BufferSize];
        for (int c = cStart; c < cEnd; ++c) {
            int x = spans[c].x;
            int length = spans[c].len;
            if (solidFill && bpp >= QPixelLayout::BPP8 && spans[c].coverage == 255 && length && op.destStoreFP) {
                // If dest doesn't matter we don't need to bother with blending or converting all the identical pixels
                op.destStoreFP(data->rasterBuffer, x, spans[c].y, &color, 1);
                spanfill_from_first(data->rasterBuffer, bpp, x, spans[c].y, length);
                length = 0;
            }

            while (length) {
                int l = qMin(BufferSize, length);
                QRgbaFloat32 *dest = op.destFetchFP(buffer, data->rasterBuffer, x, spans[c].y, l);
                op.funcSolidFP(dest, l, color, spans[c].coverage);
                if (op.destStoreFP)
                    op.destStoreFP(data->rasterBuffer, x, spans[c].y, dest, l);
                length -= l;
                x += l;
            }
        }
    };
    QT_THREAD_PARALLEL_FILLS(function);
#else
    blend_color_generic(count, spans, userData);
#endif
}